

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O3

duckdb_state duckdb_append_data_chunk(duckdb_appender appender,duckdb_data_chunk chunk)

{
  type this;
  duckdb_state dVar1;
  
  dVar1 = DuckDBError;
  if ((appender != (duckdb_appender)0x0 && chunk != (duckdb_data_chunk)0x0) &&
     (*(long *)appender != 0)) {
    this = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator*((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                     appender);
    dVar1 = DuckDBSuccess;
    duckdb::BaseAppender::AppendDataChunk(&this->super_BaseAppender,(DataChunk *)chunk);
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_append_data_chunk(duckdb_appender appender, duckdb_data_chunk chunk) {
	if (!chunk) {
		return DuckDBError;
	}
	auto data_chunk = reinterpret_cast<duckdb::DataChunk *>(chunk);
	return duckdb_appender_run_function(appender, [&](Appender &appender) { appender.AppendDataChunk(*data_chunk); });
}